

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

Path * __thiscall tinyusdz::Path::operator=(Path *this,Path *rhs)

{
  this->_valid = rhs->_valid;
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&this->_prop_part);
  std::__cxx11::string::_M_assign((string *)&this->_element);
  return this;
}

Assistant:

Path &operator=(const Path &rhs) {
    this->_valid = rhs._valid;

    this->_prim_part = rhs._prim_part;
    this->_prop_part = rhs._prop_part;
    this->_element = rhs._element;

    return (*this);
  }